

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  vec<6U,_float> *v;
  undefined8 uVar1;
  undefined8 uVar2;
  tile_details *ptVar3;
  long lVar4;
  uint i;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint16 uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint local_38;
  
  uVar13 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
  uVar6 = (ulong)(this->m_tiles).m_size;
  uVar7 = (uVar6 * data) / uVar13;
  do {
    local_38 = (uint)(((data + 1) * uVar6) / uVar13);
    if (local_38 <= (uint)uVar7) {
      return;
    }
    ptVar3 = (this->m_tiles).m_p;
    uVar8 = uVar7 & 0xffffffff;
    if (ptVar3[uVar8].pixels.m_size != 0) {
      v = &ptVar3[uVar8].color_endpoint;
      uVar5 = tree_clusterizer<crnlib::vec<6U,_float>_>::get_node_index
                        ((tree_clusterizer<crnlib::vec<6U,_float>_> *)pData_ptr,v);
      fVar14 = vec<6U,_float>::squared_distance
                         ((vec<6U,_float> *)
                          ((ulong)uVar5 * 0x18 + *(long *)((long)pData_ptr + 0x98)),v);
      lVar10 = 0x10;
      uVar12 = 0;
      fVar15 = 1e+37;
      for (uVar9 = 0; uVar11 = (uint16)uVar12, *(uint *)((long)pData_ptr + 0xa0) != uVar9;
          uVar9 = uVar9 + 1) {
        lVar4 = *(long *)((long)pData_ptr + 0x98);
        uVar1 = *(undefined8 *)(lVar4 + -0x10 + lVar10);
        fVar16 = (float)uVar1 - (float)*(undefined8 *)v->m_s;
        fVar17 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)*(undefined8 *)v->m_s >> 0x20);
        fVar16 = fVar17 * fVar17 + fVar16 * fVar16;
        if (((fVar16 <= fVar14) &&
            (uVar1 = *(undefined8 *)(lVar4 + -8 + lVar10),
            uVar2 = *(undefined8 *)(ptVar3[uVar8].color_endpoint.m_s + 2),
            fVar17 = (float)uVar1 - (float)uVar2,
            fVar18 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20),
            fVar16 = fVar18 * fVar18 + fVar17 * fVar17 + fVar16, fVar16 <= fVar14)) &&
           (uVar1 = *(undefined8 *)(ptVar3[uVar8].color_endpoint.m_s + 4),
           fVar17 = (float)*(undefined8 *)(lVar4 + lVar10) - (float)uVar1,
           fVar18 = (float)((ulong)*(undefined8 *)(lVar4 + lVar10) >> 0x20) -
                    (float)((ulong)uVar1 >> 0x20),
           fVar16 = fVar18 * fVar18 + fVar16 + fVar17 * fVar17, fVar16 < fVar15)) {
          if (fVar16 == 0.0) {
            uVar11 = (uint16)uVar9;
            break;
          }
          uVar12 = uVar9 & 0xffffffff;
          fVar15 = fVar16;
        }
        lVar10 = lVar10 + 0x18;
      }
      (this->m_tiles).m_p[uVar8].cluster_indices[0] = uVar11;
    }
    uVar7 = (ulong)((uint)uVar7 + 1);
  } while( true );
}

Assistant:

void dxt_hc::determine_color_endpoint_clusters_task(uint64 data, void* pData_ptr) {
  tree_clusterizer<vec6F>* vq = (tree_clusterizer<vec6F>*)pData_ptr;
  const crnlib::vector<vec6F>& codebook = vq->get_codebook();
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++) {
    if (m_tiles[t].pixels.size()) {
      const vec6F& v = m_tiles[t].color_endpoint;
      float node_dist = codebook[vq->get_node_index(v)].squared_distance(v);
      float best_dist = math::cNearlyInfinite;
      uint best_index = 0;
      for (uint i = 0; i < codebook.size(); i++) {
        const vec6F& c = codebook[i];
        float dist = 0;
        float d0 = c[0] - v[0]; dist += d0 * d0;
        float d1 = c[1] - v[1]; dist += d1 * d1;
        if (dist > node_dist)
          continue;
        float d2 = c[2] - v[2]; dist += d2 * d2;
        float d3 = c[3] - v[3]; dist += d3 * d3;
        if (dist > node_dist)
          continue;
        float d4 = c[4] - v[4]; dist += d4 * d4;
        float d5 = c[5] - v[5]; dist += d5 * d5;
        if (dist < best_dist) {
          best_dist = dist;
          best_index = i;
          if (best_dist == 0.0f)
            break;
        }
      }
      m_tiles[t].cluster_indices[cColor] = best_index;
    }
  }
}